

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key)

{
  hash_t hashCode;
  long lVar1;
  JavascriptString *pJVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  charcount_t cVar7;
  int iVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  PropertyRecord *string1;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  DictionaryStats *this_00;
  long lVar14;
  uint uVar15;
  
  lVar1 = *(long *)this;
  uVar6 = 0;
  if (lVar1 != 0) {
    hashCode = (*key)->hash * 2 + 1;
    uVar6 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar15 = *(uint *)(lVar1 + (ulong)uVar6 * 4);
    uVar6 = 0;
    if (-1 < (int)uVar15) {
      lVar1 = *(long *)(this + 8);
      uVar6 = 0;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pJVar2 = *(JavascriptString **)(lVar1 + 0x10 + (ulong)uVar15 * 0x20);
        pcVar10 = Js::JavascriptString::GetString(pJVar2);
        cVar7 = Js::JavascriptString::GetLength(pJVar2);
        if (cVar7 == 0) {
          iVar8 = 0x2393b8b;
        }
        else {
          uVar11 = 0x811c9dc5;
          uVar12 = 0;
          do {
            uVar13 = (ushort)pcVar10[uVar12] ^ uVar11;
            uVar11 = uVar13 * 0x1000193;
            uVar12 = uVar12 + 1;
          } while (cVar7 != uVar12);
          iVar8 = uVar13 * 0x2000326 + 1;
        }
        lVar14 = (ulong)uVar15 * 0x20 + lVar1;
        if (iVar8 != *(int *)(lVar14 + 0x18)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        if (*(hash_t *)(lVar14 + 0x18) == hashCode) {
          pJVar2 = *(JavascriptString **)(lVar14 + 0x10);
          pPVar3 = *key;
          cVar7 = Js::JavascriptString::GetLength(pJVar2);
          if ((cVar7 == pPVar3->byteCount >> 1) && (0xf < (uint)pPVar3->pid)) {
            string1 = (PropertyRecord *)Js::JavascriptString::GetString(pJVar2);
            cVar7 = Js::JavascriptString::GetLength(pJVar2);
            if (string1 != pPVar3 + 1) {
              iVar8 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(pPVar3 + 1),(ulong)cVar7);
              if (iVar8 != 0) goto LAB_00e32450;
            }
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_00e3246d;
          }
        }
LAB_00e32450:
        uVar6 = uVar6 + 1;
        uVar15 = *(uint *)(lVar14 + 8);
      } while (-1 < (int)uVar15);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar15 = 0xffffffff;
LAB_00e3246d:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar6);
  }
  return uVar15;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }